

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O1

bool TryCreateDirectories(path *p)

{
  long lVar1;
  char cVar2;
  undefined1 uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::filesystem::symlink_status(&p->super_path);
  if (cVar2 == '\x03') {
    cVar2 = std::filesystem::status(&p->super_path);
    if (cVar2 == '\x02') {
      uVar3 = 0;
      goto LAB_001550ee;
    }
  }
  uVar3 = std::filesystem::create_directories(&p->super_path);
LAB_001550ee:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool TryCreateDirectories(const fs::path& p)
{
    try {
        return fs::create_directories(p);
    } catch (const fs::filesystem_error&) {
        if (!fs::exists(p) || !fs::is_directory(p))
            throw;
    }

    // create_directories didn't create the directory, it had to have existed already
    return false;
}